

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O3

bool __thiscall
ctemplate::TemplateCache::AddAlternateTemplateRootDirectoryHelper
          (TemplateCache *this,string *directory,bool clear_template_search_path)

{
  bool bVar1;
  int iVar2;
  Mutex *pMVar3;
  pointer pcVar4;
  bool bVar5;
  char *__buf;
  char *pcVar6;
  size_t sVar7;
  int *piVar8;
  ostream *poVar9;
  string normalized;
  string local_90;
  string local_70;
  string local_50;
  
  pMVar3 = this->mutex_;
  iVar2 = pMVar3->mutex_;
  pMVar3->mutex_ = iVar2 + 1;
  if (iVar2 < 0) {
    __assert_fail("++mutex_ > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                  ,0xef,"void ctemplate::Mutex::ReaderLock()");
  }
  bVar1 = this->is_frozen_;
  pMVar3->mutex_ = iVar2;
  if (bVar1 == false) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    pcVar4 = (directory->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar4,pcVar4 + directory->_M_string_length);
    NormalizeDirectory(&local_90);
    bVar5 = IsAbspath(&local_90);
    if (!bVar5) {
      __buf = (char *)operator_new__(0x1000);
      pcVar6 = getcwd(__buf,0x1000);
      if (pcVar6 == (char *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"WARNING: [",10);
        piVar8 = __errno_location();
        pcVar6 = strerror(*piVar8);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x150350);
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unable to convert \'",0x13);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_90._M_dataplus._M_p,
                            local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"\' to an absolute path, with cwd=",0x20);
        sVar7 = strlen(__buf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,__buf,sVar7);
      }
      else {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        sVar7 = strlen(pcVar6);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar6,pcVar6 + sVar7);
        PathJoin(&local_50,&local_70,&local_90);
        std::__cxx11::string::operator=((string *)&local_90,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
      operator_delete__(__buf);
    }
    pMVar3 = this->search_path_mutex_;
    iVar2 = pMVar3->mutex_;
    pMVar3->mutex_ = pMVar3->mutex_ + -1;
    if (iVar2 != 0) {
      __assert_fail("--mutex_ == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                    ,0xea,"void ctemplate::Mutex::Lock()");
    }
    if (clear_template_search_path) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->search_path_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->search_path_,&local_90);
    pMVar3->mutex_ = pMVar3->mutex_ + 1;
    if (pMVar3->mutex_ != 0) {
      __assert_fail("mutex_++ == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/mutex.h"
                    ,0xeb,"void ctemplate::Mutex::Unlock()");
    }
    ReloadAllIfChanged(this,LAZY_RELOAD);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool TemplateCache::AddAlternateTemplateRootDirectoryHelper(
    const string& directory,
    bool clear_template_search_path) {
  {
    ReaderMutexLock ml(mutex_);
    if (is_frozen_) {  // Cannot set root-directory on a frozen cache.
      return false;
    }
  }
  string normalized = directory;
  // make sure it ends with '/'
  NormalizeDirectory(&normalized);
  // Make the directory absolute if it isn't already.  This makes code
  // safer if client later does a chdir.
  if (!IsAbspath(normalized)) {
    char* cwdbuf = new char[PATH_MAX];   // new to avoid stack overflow
    const char* cwd = getcwd(cwdbuf, PATH_MAX);
    if (!cwd) {   // probably not possible, but best to be defensive
      PLOG(WARNING) << "Unable to convert '" << normalized
                    << "' to an absolute path, with cwd=" << cwdbuf;
    } else {
      normalized = PathJoin(cwd, normalized);
    }
    delete[] cwdbuf;
  }

  VLOG(2) << "Setting Template directory to " << normalized << endl;
  {
    WriterMutexLock ml(search_path_mutex_);
    if (clear_template_search_path) {
      search_path_.clear();
    }
    search_path_.push_back(normalized);
  }

  // NOTE(williasr): The template root is not part of the template
  // cache key, so we need to invalidate the cache contents.
  ReloadAllIfChanged(LAZY_RELOAD);
  return true;
}